

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::forward
          (DeconvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar8;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  int *piVar12;
  void *pvVar13;
  Layer *pLVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  Mat *pMVar20;
  byte bVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  _func_int *p_Var30;
  _func_int **pp_Var31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  float *pfVar36;
  int _h;
  _func_int *p_Var37;
  uint _elempack;
  int iVar38;
  int iVar39;
  void *pvVar40;
  undefined1 (*pauVar41) [32];
  undefined1 (*pauVar42) [16];
  int iVar43;
  int iVar44;
  uint uVar45;
  size_t sVar46;
  int _w;
  int iVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [28];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar110 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  float fVar193;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar192;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_2b8;
  ulong local_2a8;
  undefined1 local_298 [16];
  ulong local_280;
  int local_278;
  Mat local_238;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  long local_1d0;
  Mat *local_1c8;
  _func_int **local_1c0;
  Mat local_1b8;
  Mat *local_170;
  Mat local_168;
  long local_120;
  void *local_118;
  void *local_110;
  void *local_108;
  int *local_100;
  ulong local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  void *local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar78 [64];
  undefined1 auVar73 [32];
  undefined1 auVar102 [32];
  undefined1 auVar113 [32];
  
  uVar11 = bottom_blob->elemsize;
  iVar38 = bottom_blob->elempack;
  p_Var30 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
  uVar23 = 1;
  if (opt->use_packing_layout == true) {
    uVar23 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var30) & 7) != 0) {
      uVar23 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var30) & 3) == 0) * 3 + 1;
    }
  }
  uVar3 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  auVar164._4_4_ = uVar8;
  auVar164._0_4_ = uVar3;
  uVar4 = *(ulong *)(&this->field_0xd4 + (long)p_Var30);
  uVar5 = *(ulong *)(&this->field_0xe4 + (long)p_Var30);
  uVar6 = *(ulong *)(&this->field_0xdc + (long)p_Var30);
  uVar7 = *(ulong *)(&this->field_0xfc + (long)p_Var30);
  uVar45 = bottom_blob->c;
  uVar34 = (ulong)uVar45;
  local_238.cstep = 0;
  auVar109 = (undefined1  [16])0x0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  p_Var37 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
  p_Var30 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_fma + (long)p_Var37);
  lVar35 = 0x10;
  uStack_1e0 = 0;
  if (((((*(int *)(&this->field_0xec + (long)p_Var37) < 1) && (*(int *)(p_Var30 + 0xf0) < 1)) &&
       (*(int *)(p_Var30 + 0xf4) < 1)) && (*(int *)(p_Var30 + 0xf8) < 1)) &&
     ((*(int *)(p_Var30 + 0x104) < 1 || (*(int *)(p_Var30 + 0x108) < 1)))) {
    auVar109 = (undefined1  [16])0x0;
    if (&local_238 != top_blob) {
      piVar12 = top_blob->refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      local_238.data = top_blob->data;
      local_238.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_238.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_238.elemsize = top_blob->elemsize;
      local_238.elempack = top_blob->elempack;
      local_238.allocator = top_blob->allocator;
      auVar109._0_4_ = top_blob->dims;
      auVar109._4_4_ = top_blob->w;
      uVar9 = top_blob->h;
      uVar10 = top_blob->d;
      auVar109._8_8_ = CONCAT44(uVar10,uVar9);
      local_238.c = top_blob->c;
      local_238.cstep = top_blob->cstep;
      p_Var37 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
      local_238.dims = auVar109._0_4_;
      local_238.w = auVar109._4_4_;
      local_238._48_8_ = auVar109._8_8_;
    }
    p_Var30 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_fma + (long)p_Var37);
    lVar35 = 8;
  }
  auVar164._8_8_ = 0;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar6;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar5;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar7;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar4;
  auVar65 = vpcmpeqd_avx(auVar109,auVar109);
  auVar109 = vpaddd_avx(auVar164,auVar65);
  auVar109 = vpmulld_avx(auVar122,auVar109);
  auVar109 = vpaddd_avx(auVar109,auVar133);
  auVar164 = vpaddd_avx(auVar148,auVar65);
  auVar164 = vpmulld_avx(auVar164,auVar107);
  auVar109 = vpaddd_avx(auVar164,auVar109);
  local_298 = vpsubd_avx(auVar109,auVar65);
  sVar46 = (uVar11 / (ulong)(long)iVar38) * (ulong)uVar23;
  _w = local_298._0_4_;
  _h = local_298._4_4_;
  local_1e8._0_4_ = uVar3;
  local_1e8._4_4_ = uVar8;
  local_170 = top_blob;
  Mat::create(&local_238,_w,_h,*(int *)(p_Var30 + 0xd0) / (int)uVar23,sVar46,uVar23,
              *(Allocator **)(&opt->lightmode + lVar35));
  iVar32 = local_1e8._4_4_;
  iVar27 = (int)local_1e8;
  pvVar40 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
  iVar39 = -100;
  local_1e8 = pvVar40;
  if ((local_238.data == (void *)0x0) || ((long)local_238.c * local_238.cstep == 0))
  goto LAB_0042f47f;
  p_Var30 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
  iVar22 = iVar38 * uVar45;
  iVar39 = *(int *)(&this->field_0x114 + (long)p_Var30);
  if ((iVar22 == iVar39) && (iVar22 == *(int *)(&this->field_0xd0 + (long)p_Var30))) {
    iVar22 = *(int *)(&this->field_0xd8 + (long)p_Var30) *
             *(int *)(&this->field_0xd4 + (long)p_Var30);
    iVar47 = auVar164._0_4_;
    iVar39 = auVar164._4_4_;
    local_1c8 = bottom_blob;
    if (iVar38 == 1) {
      if (0 < (int)uVar45) {
        local_1d0 = local_238.cstep * local_238.elemsize;
        local_110 = local_238.data;
        pvVar13 = (this->weight_data_tm).data;
        iVar38 = bottom_blob->w;
        local_118 = bottom_blob->data;
        sVar46 = bottom_blob->elemsize;
        local_120 = bottom_blob->cstep * sVar46;
        auVar109 = vpcmpgtd_avx(local_298,(undefined1  [16])0x0);
        auVar109 = vpmovsxdq_avx(auVar109);
        uVar23 = vmovmskpd_avx(auVar109);
        local_1c8 = (Mat *)CONCAT71((int7)((ulong)bottom_blob >> 8),(byte)uVar23 >> 1);
        local_280 = 0;
        do {
          if ((char)local_1c8 != '\0') {
            pvVar40 = (void *)(local_120 * local_280 + (long)local_118);
            pfVar36 = (float *)(local_1d0 * local_280 + (long)local_110);
            local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_fma;
            iVar43 = 0;
            do {
              if ((uVar23 & 1) != 0) {
                iVar44 = 0;
                local_298._0_4_ = -iVar47;
                do {
                  p_Var30 = local_1c0[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var30) == 0) {
                    auVar142 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar142 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var30) +
                                                local_280 * 4));
                  }
                  auVar109 = auVar142._0_16_;
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var30)) {
                    iVar24 = 0;
                    do {
                      iVar25 = *(int *)(&this->field_0xe0 + (long)p_Var30) * iVar24 +
                               (iVar43 - iVar39);
                      if (((-1 < iVar25) &&
                          (iVar26 = iVar25 / *(int *)(&this->field_0xe8 + (long)p_Var30),
                          iVar25 % *(int *)(&this->field_0xe8 + (long)p_Var30) == 0)) &&
                         (iVar26 < iVar32)) {
                        iVar25 = *(int *)(&this->field_0xd4 + (long)p_Var30);
                        if (0 < (long)iVar25) {
                          lVar35 = 0;
                          iVar33 = local_298._0_4_;
                          do {
                            if (((-1 < iVar33) &&
                                (iVar29 = iVar33 / *(int *)(&this->field_0xe4 + (long)p_Var30),
                                iVar33 % *(int *)(&this->field_0xe4 + (long)p_Var30) == 0)) &&
                               (iVar29 < iVar27)) {
                              auVar109 = vfmadd231ss_fma(auVar142._0_16_,
                                                         ZEXT416(*(uint *)((long)pvVar13 +
                                                                          lVar35 * 4 +
                                                                          (ulong)(uint)(iVar25 * 
                                                  iVar24) * 4)),
                                                  ZEXT416(*(uint *)((long)pvVar40 +
                                                                   (long)iVar29 * 4 +
                                                                   (long)iVar26 *
                                                                   (long)iVar38 * sVar46)));
                              auVar142 = ZEXT1664(auVar109);
                            }
                            lVar35 = lVar35 + 1;
                            iVar33 = iVar33 + *(int *)(&this->field_0xdc + (long)p_Var30);
                          } while (iVar25 != lVar35);
                        }
                      }
                      auVar109 = auVar142._0_16_;
                      iVar24 = iVar24 + 1;
                    } while (iVar24 != *(int *)(&this->field_0xd8 + (long)p_Var30));
                  }
                  fVar192 = auVar109._0_4_;
                  fVar48 = fVar192;
                  local_1e8 = pvVar40;
                  switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var30)) {
                  case 1:
                    auVar109 = vmaxss_avx(auVar109,ZEXT416(0));
                    fVar48 = auVar109._0_4_;
                    break;
                  case 2:
                    auVar109 = vcmpss_avx(ZEXT816(0) << 0x40,auVar109,1);
                    auVar96._8_4_ = 0x3f800000;
                    auVar96._0_8_ = 0x3f8000003f800000;
                    auVar96._12_4_ = 0x3f800000;
                    auVar109 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var30)
                                                    ),auVar96,auVar109);
                    fVar48 = auVar109._0_4_ * fVar192;
                    break;
                  case 3:
                    fVar192 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var30))[1];
                    auVar109 = vmaxss_avx(auVar109,ZEXT416(**(uint **)(&this->field_0x120 +
                                                                      (long)p_Var30)));
                    fVar48 = auVar109._0_4_;
                    if (fVar192 < auVar109._0_4_) {
                      fVar48 = fVar192;
                    }
                    break;
                  case 4:
                    auVar109 = vminss_avx(auVar109,ZEXT416(0x42b0c0a5));
                    auVar65._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
                    auVar65._8_4_ = auVar109._8_4_ ^ 0x80000000;
                    auVar65._12_4_ = auVar109._12_4_ ^ 0x80000000;
                    auVar109 = vcmpss_avx(auVar109,ZEXT416(0xc2b0c0a5),1);
                    auVar95._8_4_ = 0x42b0c0a5;
                    auVar95._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar95._12_4_ = 0x42b0c0a5;
                    auVar109 = vblendvps_avx(auVar65,auVar95,auVar109);
                    fVar48 = expf(auVar109._0_4_);
                    fVar48 = 1.0 / (fVar48 + 1.0);
                    pvVar40 = local_1e8;
                    break;
                  case 5:
                    fVar48 = expf(fVar192);
                    fVar48 = logf(fVar48 + 1.0);
                    fVar48 = tanhf(fVar48);
                    fVar48 = fVar48 * fVar192;
                    pvVar40 = local_1e8;
                    break;
                  case 6:
                    fVar193 = **(float **)(&this->field_0x120 + (long)p_Var30);
                    fVar2 = (*(float **)(&this->field_0x120 + (long)p_Var30))[1];
                    fVar106 = -fVar2 / fVar193;
                    fVar48 = 0.0;
                    if ((fVar106 <= fVar192) &&
                       (fVar48 = fVar192, fVar192 <= fVar106 + 1.0 / fVar193)) {
                      auVar109 = vfmadd213ss_fma(ZEXT416((uint)fVar193),auVar109,
                                                 ZEXT416((uint)fVar2));
                      fVar48 = auVar109._0_4_ * fVar192;
                    }
                  }
                  *pfVar36 = fVar48;
                  pfVar36 = pfVar36 + 1;
                  iVar44 = iVar44 + 1;
                  local_298._0_4_ = local_298._0_4_ + 1;
                } while (iVar44 != _w);
              }
              iVar43 = iVar43 + 1;
            } while (iVar43 != _h);
          }
          local_280 = local_280 + 1;
          pvVar13 = (void *)((long)pvVar13 + (long)iVar22 * 4);
        } while (local_280 != uVar34);
      }
    }
    else if (iVar38 == 4) {
      if (0 < (int)uVar45) {
        auVar109 = vpcmpgtd_avx(local_298,(undefined1  [16])0x0);
        auVar109 = vpmovsxdq_avx(auVar109);
        uVar23 = vmovmskpd_avx(auVar109);
        bVar21 = (byte)uVar23 >> 1;
        local_1d0 = CONCAT71(local_1d0._1_7_,bVar21);
        local_2a8 = 0;
        auVar179 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar142 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar178._8_4_ = 0xc2b0c0a5;
        auVar178._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar178._12_4_ = 0xc2b0c0a5;
        auVar182._8_4_ = 0x3ab743ce;
        auVar182._0_8_ = 0x3ab743ce3ab743ce;
        auVar182._12_4_ = 0x3ab743ce;
        do {
          if (bVar21 != 0) {
            pvVar13 = (this->weight_data_tm).data;
            sVar46 = bottom_blob->elemsize;
            pvVar40 = (void *)(bottom_blob->cstep * local_2a8 * sVar46 + (long)bottom_blob->data);
            iVar38 = bottom_blob->w;
            pauVar42 = (undefined1 (*) [16])
                       (local_238.cstep * local_2a8 * local_238.elemsize + (long)local_238.data);
            local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_fma;
            iVar27 = 0;
            do {
              if ((uVar23 & 1) != 0) {
                iVar32 = 0;
                local_278 = -iVar47;
                do {
                  p_Var30 = local_1c0[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var30) == 0) {
                    auVar185 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar185 = *(undefined1 (*) [16])
                                (*(long *)(&this->field_0x1b0 + (long)p_Var30) + local_2a8 * 0x10);
                  }
                  auVar181 = ZEXT1664(auVar185);
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var30)) {
                    iVar44 = 0;
                    iVar43 = 0;
                    do {
                      iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var30) * iVar43 +
                               (iVar27 - iVar39);
                      if (((-1 < iVar24) &&
                          (iVar25 = iVar24 / *(int *)(&this->field_0xe8 + (long)p_Var30),
                          iVar24 % *(int *)(&this->field_0xe8 + (long)p_Var30) == 0)) &&
                         (iVar25 < local_1e8._4_4_)) {
                        lVar35 = (long)*(int *)(&this->field_0xd4 + (long)p_Var30);
                        if (0 < lVar35) {
                          uVar45 = *(int *)(&this->field_0xd4 + (long)p_Var30) * iVar44;
                          iVar24 = local_278;
                          do {
                            if (((-1 < iVar24) &&
                                (iVar26 = iVar24 / *(int *)(&this->field_0xe4 + (long)p_Var30),
                                iVar24 % *(int *)(&this->field_0xe4 + (long)p_Var30) == 0)) &&
                               (iVar26 < (int)local_1e8)) {
                              auVar109 = vfmadd231ps_fma(auVar181._0_16_,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar40 +
                                                          (long)(iVar26 << 2) * 4 +
                                                          (long)iVar25 * (long)iVar38 * sVar46),
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar13 +
                                                          (ulong)uVar45 * 4 +
                                                          (long)(iVar22 * 4 * (int)local_2a8) * 4));
                              auVar181 = ZEXT1664(auVar109);
                            }
                            uVar45 = uVar45 + 4;
                            iVar24 = iVar24 + *(int *)(&this->field_0xdc + (long)p_Var30);
                            lVar35 = lVar35 + -1;
                          } while (lVar35 != 0);
                        }
                      }
                      auVar185 = auVar181._0_16_;
                      iVar43 = iVar43 + 1;
                      iVar44 = iVar44 + 4;
                    } while (iVar43 != *(int *)(&this->field_0xd8 + (long)p_Var30));
                  }
                  auVar109 = auVar142._0_16_;
                  auVar164 = auVar179._0_16_;
                  fVar48 = auVar185._4_4_;
                  fVar192 = auVar185._8_4_;
                  fVar193 = auVar185._12_4_;
                  switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var30)) {
                  case 1:
                    auVar185 = vmaxps_avx(auVar185,_DAT_0055e860);
                    break;
                  case 2:
                    auVar109 = vmaxps_avx(auVar185,(undefined1  [16])0x0);
                    auVar164 = vminps_avx(auVar185,(undefined1  [16])0x0);
                    uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var30);
                    auVar188._4_4_ = uVar1;
                    auVar188._0_4_ = uVar1;
                    auVar188._8_4_ = uVar1;
                    auVar188._12_4_ = uVar1;
                    auVar185 = vfmadd213ps_fma(auVar188,auVar164,auVar109);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var30);
                    auVar67._4_4_ = uVar1;
                    auVar67._0_4_ = uVar1;
                    auVar67._8_4_ = uVar1;
                    auVar67._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var30))[1];
                    auVar150._4_4_ = uVar1;
                    auVar150._0_4_ = uVar1;
                    auVar150._8_4_ = uVar1;
                    auVar150._12_4_ = uVar1;
                    auVar109 = vmaxps_avx(auVar185,auVar67);
                    auVar185 = vminps_avx(auVar150,auVar109);
                    break;
                  case 4:
                    auVar68._0_8_ = auVar185._0_8_ ^ 0x8000000080000000;
                    auVar68._8_4_ = -fVar192;
                    auVar68._12_4_ = -fVar193;
                    auVar86._8_4_ = 0x42b0c0a5;
                    auVar86._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar86._12_4_ = 0x42b0c0a5;
                    auVar65 = vminps_avx(auVar68,auVar86);
                    auVar87._8_4_ = 0xc2b0c0a5;
                    auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar87._12_4_ = 0xc2b0c0a5;
                    auVar107 = vmaxps_avx(auVar65,auVar87);
                    auVar151._8_4_ = 0x3fb8aa3b;
                    auVar151._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar151._12_4_ = 0x3fb8aa3b;
                    auVar65 = vfmadd213ps_fma(auVar151,auVar107,auVar164);
                    auVar186._0_4_ = (int)auVar65._0_4_;
                    auVar186._4_4_ = (int)auVar65._4_4_;
                    auVar186._8_4_ = (int)auVar65._8_4_;
                    auVar186._12_4_ = (int)auVar65._12_4_;
                    auVar148 = vcvtdq2ps_avx(auVar186);
                    auVar65 = vcmpps_avx(auVar65,auVar148,1);
                    auVar65 = vandps_avx(auVar65,auVar109);
                    auVar65 = vsubps_avx(auVar148,auVar65);
                    auVar88._8_4_ = 0x3f318000;
                    auVar88._0_8_ = 0x3f3180003f318000;
                    auVar88._12_4_ = 0x3f318000;
                    auVar148 = vfmsub231ps_fma(auVar107,auVar65,auVar88);
                    auVar89._8_4_ = 0x395e8083;
                    auVar89._0_8_ = 0x395e8083395e8083;
                    auVar89._12_4_ = 0x395e8083;
                    auVar107 = vfmsub231ps_fma(auVar148,auVar65,auVar89);
                    auVar187._0_4_ = auVar107._0_4_ * auVar107._0_4_;
                    auVar187._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                    auVar187._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                    auVar187._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                    auVar169._8_4_ = 0x39506967;
                    auVar169._0_8_ = 0x3950696739506967;
                    auVar169._12_4_ = 0x39506967;
                    auVar90._8_4_ = 0x3ab743ce;
                    auVar90._0_8_ = 0x3ab743ce3ab743ce;
                    auVar90._12_4_ = 0x3ab743ce;
                    auVar148 = vfmadd213ps_fma(auVar169,auVar107,auVar90);
                    auVar91._8_4_ = 0x3c088908;
                    auVar91._0_8_ = 0x3c0889083c088908;
                    auVar91._12_4_ = 0x3c088908;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar107,auVar91);
                    auVar92._8_4_ = 0x3d2aa9c1;
                    auVar92._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar92._12_4_ = 0x3d2aa9c1;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar107,auVar92);
                    auVar93._8_4_ = 0x3e2aaaaa;
                    auVar93._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar93._12_4_ = 0x3e2aaaaa;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar107,auVar93);
                    auVar164 = vfmadd213ps_fma(auVar148,auVar107,auVar164);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar187,auVar107);
                    auVar69._0_4_ = auVar164._0_4_ + auVar142._0_4_;
                    auVar69._4_4_ = auVar164._4_4_ + auVar142._4_4_;
                    auVar69._8_4_ = auVar164._8_4_ + auVar142._8_4_;
                    auVar69._12_4_ = auVar164._12_4_ + auVar142._12_4_;
                    auVar152._0_4_ = (int)auVar65._0_4_;
                    auVar152._4_4_ = (int)auVar65._4_4_;
                    auVar152._8_4_ = (int)auVar65._8_4_;
                    auVar152._12_4_ = (int)auVar65._12_4_;
                    auVar164 = vpslld_avx(auVar152,0x17);
                    auVar164 = vpaddd_avx(auVar164,auVar109);
                    auVar65 = vfmadd213ps_fma(auVar164,auVar69,auVar109);
                    auVar164 = vrcpps_avx(auVar65);
                    auVar109 = vfmsub213ps_fma(auVar65,auVar164,auVar109);
                    auVar185 = vfnmadd132ps_fma(auVar109,auVar164,auVar164);
                    break;
                  case 5:
                    auVar173._8_4_ = 0x42b0c0a5;
                    auVar173._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar173._12_4_ = 0x42b0c0a5;
                    auVar65 = vminps_avx(auVar185,auVar173);
                    auVar107 = vmaxps_avx(auVar178,auVar65);
                    auVar180._8_4_ = 0x3fb8aa3b;
                    auVar180._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar180._12_4_ = 0x3fb8aa3b;
                    auVar65 = vfmadd213ps_fma(auVar180,auVar107,auVar164);
                    auVar165._0_4_ = (int)auVar65._0_4_;
                    auVar165._4_4_ = (int)auVar65._4_4_;
                    auVar165._8_4_ = (int)auVar65._8_4_;
                    auVar165._12_4_ = (int)auVar65._12_4_;
                    auVar148 = vcvtdq2ps_avx(auVar165);
                    auVar65 = vcmpps_avx(auVar65,auVar148,1);
                    auVar65 = vandps_avx(auVar65,auVar109);
                    auVar65 = vsubps_avx(auVar148,auVar65);
                    auVar49._8_4_ = 0x3f318000;
                    auVar49._0_8_ = 0x3f3180003f318000;
                    auVar49._12_4_ = 0x3f318000;
                    auVar148 = vfmsub231ps_fma(auVar107,auVar65,auVar49);
                    auVar80._8_4_ = 0xb95e8083;
                    auVar80._0_8_ = 0xb95e8083b95e8083;
                    auVar80._12_4_ = 0xb95e8083;
                    auVar107 = vfnmsub231ps_fma(auVar148,auVar65,auVar80);
                    auVar166._0_4_ = auVar107._0_4_ * auVar107._0_4_;
                    auVar166._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                    auVar166._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                    auVar166._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                    auVar174._8_4_ = 0x39506967;
                    auVar174._0_8_ = 0x3950696739506967;
                    auVar174._12_4_ = 0x39506967;
                    auVar148 = vfmadd213ps_fma(auVar174,auVar107,auVar182);
                    auVar111._8_4_ = 0x3c088908;
                    auVar111._0_8_ = 0x3c0889083c088908;
                    auVar111._12_4_ = 0x3c088908;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar107,auVar111);
                    auVar143._8_4_ = 0x3d2aa9c1;
                    auVar143._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar143._12_4_ = 0x3d2aa9c1;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar107,auVar143);
                    auVar124._8_4_ = 0x3e2aaaaa;
                    auVar124._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar124._12_4_ = 0x3e2aaaaa;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar107,auVar124);
                    auVar148 = vfmadd213ps_fma(auVar148,auVar107,auVar164);
                    auVar148 = vfmadd213ps_fma(auVar148,auVar166,auVar107);
                    auVar81._0_4_ = auVar148._0_4_ + auVar142._0_4_;
                    auVar81._4_4_ = auVar148._4_4_ + auVar142._4_4_;
                    auVar81._8_4_ = auVar148._8_4_ + auVar142._8_4_;
                    auVar81._12_4_ = auVar148._12_4_ + auVar142._12_4_;
                    auVar64._0_4_ = (int)auVar65._0_4_;
                    auVar64._4_4_ = (int)auVar65._4_4_;
                    auVar64._8_4_ = (int)auVar65._8_4_;
                    auVar64._12_4_ = (int)auVar65._12_4_;
                    auVar65 = vpslld_avx(auVar64,0x17);
                    auVar65 = vpaddd_avx(auVar65,auVar109);
                    auVar133 = vfmadd213ps_fma(auVar65,auVar81,auVar109);
                    auVar82._8_4_ = 0x800000;
                    auVar82._0_8_ = 0x80000000800000;
                    auVar82._12_4_ = 0x800000;
                    auVar65 = vmaxps_avx(auVar133,auVar82);
                    auVar148 = vpsrld_avx(auVar65,0x17);
                    auVar125._8_4_ = 0xffffff82;
                    auVar125._0_8_ = 0xffffff82ffffff82;
                    auVar125._12_4_ = 0xffffff82;
                    auVar148 = vpaddd_avx(auVar148,auVar125);
                    auVar126._8_4_ = 0x807fffff;
                    auVar126._0_8_ = 0x807fffff807fffff;
                    auVar126._12_4_ = 0x807fffff;
                    auVar65 = vandps_avx(auVar65,auVar126);
                    auVar122 = vorps_avx(auVar65,auVar164);
                    auVar107 = vcvtdq2ps_avx(auVar148);
                    auVar127._8_4_ = 0x3f3504f3;
                    auVar127._0_8_ = 0x3f3504f33f3504f3;
                    auVar127._12_4_ = 0x3f3504f3;
                    auVar148 = vcmpps_avx(auVar122,auVar127,1);
                    auVar65 = vandps_avx(auVar148,auVar122);
                    auVar83._0_4_ = auVar122._0_4_ + -1.0 + auVar65._0_4_;
                    auVar83._4_4_ = auVar122._4_4_ + -1.0 + auVar65._4_4_;
                    auVar83._8_4_ = auVar122._8_4_ + -1.0 + auVar65._8_4_;
                    auVar83._12_4_ = auVar122._12_4_ + -1.0 + auVar65._12_4_;
                    auVar109 = vandps_avx(auVar148,auVar109);
                    auVar65 = vsubps_avx(auVar107,auVar109);
                    auVar149._0_4_ = auVar83._0_4_ * auVar83._0_4_;
                    auVar149._4_4_ = auVar83._4_4_ * auVar83._4_4_;
                    auVar149._8_4_ = auVar83._8_4_ * auVar83._8_4_;
                    auVar149._12_4_ = auVar83._12_4_ * auVar83._12_4_;
                    auVar167._8_4_ = 0x3d9021bb;
                    auVar167._0_8_ = 0x3d9021bb3d9021bb;
                    auVar167._12_4_ = 0x3d9021bb;
                    auVar134._8_4_ = 0xbdebd1b8;
                    auVar134._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar134._12_4_ = 0xbdebd1b8;
                    auVar109 = vfmadd213ps_fma(auVar167,auVar83,auVar134);
                    auVar135._8_4_ = 0x3def251a;
                    auVar135._0_8_ = 0x3def251a3def251a;
                    auVar135._12_4_ = 0x3def251a;
                    auVar109 = vfmadd213ps_fma(auVar109,auVar83,auVar135);
                    auVar136._8_4_ = 0xbdfe5d4f;
                    auVar136._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar136._12_4_ = 0xbdfe5d4f;
                    auVar109 = vfmadd213ps_fma(auVar109,auVar83,auVar136);
                    auVar137._8_4_ = 0x3e11e9bf;
                    auVar137._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar137._12_4_ = 0x3e11e9bf;
                    auVar109 = vfmadd213ps_fma(auVar109,auVar83,auVar137);
                    auVar138._8_4_ = 0xbe2aae50;
                    auVar138._0_8_ = 0xbe2aae50be2aae50;
                    auVar138._12_4_ = 0xbe2aae50;
                    auVar109 = vfmadd213ps_fma(auVar109,auVar83,auVar138);
                    auVar139._8_4_ = 0x3e4cceac;
                    auVar139._0_8_ = 0x3e4cceac3e4cceac;
                    auVar139._12_4_ = 0x3e4cceac;
                    auVar109 = vfmadd213ps_fma(auVar109,auVar83,auVar139);
                    auVar140._8_4_ = 0xbe7ffffc;
                    auVar140._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar140._12_4_ = 0xbe7ffffc;
                    auVar109 = vfmadd213ps_fma(auVar109,auVar83,auVar140);
                    auVar141._8_4_ = 0x3eaaaaaa;
                    auVar141._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar141._12_4_ = 0x3eaaaaaa;
                    auVar109 = vfmadd213ps_fma(auVar109,auVar83,auVar141);
                    auVar163._0_4_ = auVar149._0_4_ * auVar83._0_4_ * auVar109._0_4_;
                    auVar163._4_4_ = auVar149._4_4_ * auVar83._4_4_ * auVar109._4_4_;
                    auVar163._8_4_ = auVar149._8_4_ * auVar83._8_4_ * auVar109._8_4_;
                    auVar163._12_4_ = auVar149._12_4_ * auVar83._12_4_ * auVar109._12_4_;
                    auVar168._8_4_ = 0xb95e8083;
                    auVar168._0_8_ = 0xb95e8083b95e8083;
                    auVar168._12_4_ = 0xb95e8083;
                    auVar109 = vfmadd231ps_fma(auVar163,auVar65,auVar168);
                    auVar148 = vfmsub231ps_fma(auVar109,auVar164,auVar149);
                    auVar109 = vcmpps_avx(auVar133,ZEXT816(0) << 0x20,2);
                    auVar148 = vsubps_avx(auVar148,auVar83);
                    auVar175._8_4_ = 0x42b0c0a5;
                    auVar175._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar175._12_4_ = 0x42b0c0a5;
                    auVar144._8_4_ = 0x3f800000;
                    auVar144._0_8_ = 0x3f8000003f800000;
                    auVar144._12_4_ = 0x3f800000;
                    auVar65 = vfnmadd231ps_fma(auVar148,auVar49,auVar65);
                    auVar84._0_4_ = auVar65._0_4_ + auVar65._0_4_;
                    auVar84._4_4_ = auVar65._4_4_ + auVar65._4_4_;
                    auVar84._8_4_ = auVar65._8_4_ + auVar65._8_4_;
                    auVar84._12_4_ = auVar65._12_4_ + auVar65._12_4_;
                    auVar128._8_4_ = 0x7fffffff;
                    auVar128._0_8_ = 0x7fffffff7fffffff;
                    auVar128._12_4_ = 0x7fffffff;
                    auVar109 = vblendvps_avx(auVar84,auVar128,auVar109);
                    auVar109 = vminps_avx(auVar175,auVar109);
                    auVar148 = vmaxps_avx(auVar178,auVar109);
                    auVar109 = vfmadd213ps_fma(auVar180,auVar148,auVar164);
                    auVar129._0_4_ = (int)auVar109._0_4_;
                    auVar129._4_4_ = (int)auVar109._4_4_;
                    auVar129._8_4_ = (int)auVar109._8_4_;
                    auVar129._12_4_ = (int)auVar109._12_4_;
                    auVar65 = vcvtdq2ps_avx(auVar129);
                    auVar109 = vcmpps_avx(auVar109,auVar65,1);
                    auVar109 = vandps_avx(auVar109,auVar144);
                    auVar109 = vsubps_avx(auVar65,auVar109);
                    auVar65 = vfmsub231ps_fma(auVar148,auVar109,auVar49);
                    auVar50._8_4_ = 0xb95e8083;
                    auVar50._0_8_ = 0xb95e8083b95e8083;
                    auVar50._12_4_ = 0xb95e8083;
                    auVar148 = vfnmsub231ps_fma(auVar65,auVar109,auVar50);
                    auVar130._0_4_ = auVar148._0_4_ * auVar148._0_4_;
                    auVar130._4_4_ = auVar148._4_4_ * auVar148._4_4_;
                    auVar130._8_4_ = auVar148._8_4_ * auVar148._8_4_;
                    auVar130._12_4_ = auVar148._12_4_ * auVar148._12_4_;
                    auVar65 = vfmadd213ps_fma(auVar174,auVar148,auVar182);
                    auVar65 = vfmadd213ps_fma(auVar65,auVar148,auVar111);
                    auVar65 = vfmadd213ps_fma(auVar65,auVar148,auVar143);
                    auVar51._8_4_ = 0x3e2aaaaa;
                    auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar51._12_4_ = 0x3e2aaaaa;
                    auVar65 = vfmadd213ps_fma(auVar65,auVar148,auVar51);
                    auVar179 = ZEXT1664(auVar164);
                    auVar164 = vfmadd213ps_fma(auVar65,auVar148,auVar164);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar130,auVar148);
                    auVar66._0_4_ = auVar164._0_4_ + 1.0;
                    auVar66._4_4_ = auVar164._4_4_ + 1.0;
                    auVar66._8_4_ = auVar164._8_4_ + 1.0;
                    auVar66._12_4_ = auVar164._12_4_ + 1.0;
                    auVar85._0_4_ = (int)auVar109._0_4_;
                    auVar85._4_4_ = (int)auVar109._4_4_;
                    auVar85._8_4_ = (int)auVar109._8_4_;
                    auVar85._12_4_ = (int)auVar109._12_4_;
                    auVar109 = vpslld_avx(auVar85,0x17);
                    auVar109 = vpaddd_avx(auVar109,auVar144);
                    auVar142 = ZEXT1664(auVar144);
                    auVar164 = vfmadd213ps_fma(auVar109,auVar66,auVar144);
                    auVar109 = vrcpps_avx(auVar164);
                    auVar131._0_4_ = auVar109._0_4_ + auVar109._0_4_;
                    auVar131._4_4_ = auVar109._4_4_ + auVar109._4_4_;
                    auVar131._8_4_ = auVar109._8_4_ + auVar109._8_4_;
                    auVar131._12_4_ = auVar109._12_4_ + auVar109._12_4_;
                    auVar112._8_4_ = 0x40000000;
                    auVar112._0_8_ = 0x4000000040000000;
                    auVar112._12_4_ = 0x40000000;
                    auVar164 = vfmsub213ps_fma(auVar164,auVar131,auVar112);
                    auVar109 = vfnmadd213ps_fma(auVar164,auVar109,auVar131);
                    auVar185 = vfmsub231ps_fma(auVar185,auVar185,auVar109);
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var30);
                    auVar70._4_4_ = uVar1;
                    auVar70._0_4_ = uVar1;
                    auVar70._8_4_ = uVar1;
                    auVar70._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var30))[1];
                    auVar94._4_4_ = uVar1;
                    auVar94._0_4_ = uVar1;
                    auVar94._8_4_ = uVar1;
                    auVar94._12_4_ = uVar1;
                    auVar164 = vfmadd231ps_fma(auVar94,auVar185,auVar70);
                    auVar164 = vmaxps_avx(auVar164,_DAT_0055e860);
                    auVar109 = vminps_avx(auVar164,auVar109);
                    auVar185._0_4_ = auVar185._0_4_ * auVar109._0_4_;
                    auVar185._4_4_ = fVar48 * auVar109._4_4_;
                    auVar185._8_4_ = fVar192 * auVar109._8_4_;
                    auVar185._12_4_ = fVar193 * auVar109._12_4_;
                  }
                  *pauVar42 = auVar185;
                  pauVar42 = pauVar42 + 1;
                  iVar32 = iVar32 + 1;
                  local_278 = local_278 + 1;
                } while (iVar32 != _w);
              }
              iVar27 = iVar27 + 1;
            } while (iVar27 != _h);
          }
          local_2a8 = local_2a8 + 1;
        } while (local_2a8 != uVar34);
      }
    }
    else if ((iVar38 == 8) && (0 < (int)uVar45)) {
      auVar109 = vpcmpgtd_avx(local_298,(undefined1  [16])0x0);
      auVar109 = vpmovsxdq_avx(auVar109);
      uVar23 = vmovmskpd_avx(auVar109);
      bVar21 = (byte)uVar23 >> 1;
      local_1d0 = CONCAT71(local_1d0._1_7_,bVar21);
      local_2a8 = 0;
      auVar179 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar145._8_4_ = 0x3f000000;
      auVar145._0_8_ = 0x3f0000003f000000;
      auVar145._12_4_ = 0x3f000000;
      auVar145._16_4_ = 0x3f000000;
      auVar145._20_4_ = 0x3f000000;
      auVar145._24_4_ = 0x3f000000;
      auVar145._28_4_ = 0x3f000000;
      auVar181 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar142 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar184 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (bVar21 != 0) {
          pvVar13 = (this->weight_data_tm).data;
          sVar46 = bottom_blob->elemsize;
          pvVar40 = (void *)(bottom_blob->cstep * local_2a8 * sVar46 + (long)bottom_blob->data);
          iVar38 = bottom_blob->w;
          pauVar41 = (undefined1 (*) [32])
                     (local_238.cstep * local_2a8 * local_238.elemsize + (long)local_238.data);
          local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_fma;
          iVar27 = 0;
          do {
            if ((uVar23 & 1) != 0) {
              iVar32 = 0;
              local_278 = -iVar47;
              do {
                p_Var30 = local_1c0[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var30) == 0) {
                  auVar77 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar77 = ZEXT3264(*(undefined1 (*) [32])
                                      (*(long *)(&this->field_0x1b0 + (long)p_Var30) +
                                      local_2a8 * 0x20));
                }
                if (0 < *(int *)(&this->field_0xd8 + (long)p_Var30)) {
                  iVar44 = 0;
                  iVar43 = 0;
                  do {
                    iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var30) * iVar43 +
                             (iVar27 - iVar39);
                    if (((-1 < iVar24) &&
                        (iVar25 = iVar24 / *(int *)(&this->field_0xe8 + (long)p_Var30),
                        iVar24 % *(int *)(&this->field_0xe8 + (long)p_Var30) == 0)) &&
                       (iVar25 < local_1e8._4_4_)) {
                      lVar35 = (long)*(int *)(&this->field_0xd4 + (long)p_Var30);
                      if (0 < lVar35) {
                        uVar45 = *(int *)(&this->field_0xd4 + (long)p_Var30) * iVar44;
                        iVar24 = local_278;
                        do {
                          if (((-1 < iVar24) &&
                              (iVar26 = iVar24 / *(int *)(&this->field_0xe4 + (long)p_Var30),
                              iVar24 % *(int *)(&this->field_0xe4 + (long)p_Var30) == 0)) &&
                             (iVar26 < (int)local_1e8)) {
                            auVar109 = vfmadd231ps_fma(auVar77._0_32_,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar40 +
                                                        (long)(iVar26 << 3) * 4 +
                                                        (long)iVar25 * (long)iVar38 * sVar46),
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar13 +
                                                        (ulong)uVar45 * 4 +
                                                        (long)(iVar22 * 8 * (int)local_2a8) * 4));
                            auVar77 = ZEXT1664(auVar109);
                          }
                          uVar45 = uVar45 + 8;
                          iVar24 = iVar24 + *(int *)(&this->field_0xdc + (long)p_Var30);
                          lVar35 = lVar35 + -1;
                        } while (lVar35 != 0);
                      }
                    }
                    iVar43 = iVar43 + 1;
                    iVar44 = iVar44 + 8;
                  } while (iVar43 != *(int *)(&this->field_0xd8 + (long)p_Var30));
                }
                auVar76 = auVar77._0_32_;
                auVar59 = auVar142._0_32_;
                auVar57 = auVar184._0_32_;
                auVar72 = auVar179._0_32_;
                auVar121 = auVar181._0_32_;
                fVar48 = auVar142._0_4_;
                fVar192 = auVar142._4_4_;
                fVar193 = auVar142._8_4_;
                fVar2 = auVar142._12_4_;
                fVar106 = auVar142._16_4_;
                fVar15 = auVar142._20_4_;
                fVar16 = auVar142._24_4_;
                fVar17 = auVar142._28_4_;
                auVar78._28_36_ = auVar77._28_36_;
                switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var30)) {
                case 1:
                  auVar76 = vmaxps_avx(auVar76,_DAT_00561140);
                  break;
                case 2:
                  auVar59 = vmaxps_avx(auVar76,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar76 = vminps_avx(auVar76,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var30);
                  auVar75._4_4_ = uVar1;
                  auVar75._0_4_ = uVar1;
                  auVar75._8_4_ = uVar1;
                  auVar75._12_4_ = uVar1;
                  auVar75._16_4_ = uVar1;
                  auVar75._20_4_ = uVar1;
                  auVar75._24_4_ = uVar1;
                  auVar75._28_4_ = uVar1;
                  auVar109 = vfmadd213ps_fma(auVar75,auVar76,auVar59);
                  auVar76 = ZEXT1632(auVar109);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var30);
                  auVar104._4_4_ = uVar1;
                  auVar104._0_4_ = uVar1;
                  auVar104._8_4_ = uVar1;
                  auVar104._12_4_ = uVar1;
                  auVar104._16_4_ = uVar1;
                  auVar104._20_4_ = uVar1;
                  auVar104._24_4_ = uVar1;
                  auVar104._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var30))[1];
                  auVar191._4_4_ = uVar1;
                  auVar191._0_4_ = uVar1;
                  auVar191._8_4_ = uVar1;
                  auVar191._12_4_ = uVar1;
                  auVar191._16_4_ = uVar1;
                  auVar191._20_4_ = uVar1;
                  auVar191._24_4_ = uVar1;
                  auVar191._28_4_ = uVar1;
                  auVar76 = vmaxps_avx(auVar76,auVar104);
                  auVar76 = vminps_avx(auVar191,auVar76);
                  break;
                case 4:
                  auVar71._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                  auVar71._8_4_ = -auVar77._8_4_;
                  auVar71._12_4_ = -auVar77._12_4_;
                  auVar71._16_4_ = -auVar77._16_4_;
                  auVar71._20_4_ = -auVar77._20_4_;
                  auVar71._24_4_ = -auVar77._24_4_;
                  auVar71._28_4_ = auVar77._28_4_ ^ 0x80000000;
                  auVar60._8_4_ = 0x42b0c0a5;
                  auVar60._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar60._12_4_ = 0x42b0c0a5;
                  auVar60._16_4_ = 0x42b0c0a5;
                  auVar60._20_4_ = 0x42b0c0a5;
                  auVar60._24_4_ = 0x42b0c0a5;
                  auVar60._28_4_ = 0x42b0c0a5;
                  auVar76 = vminps_avx(auVar71,auVar60);
                  auVar72 = vmaxps_avx(auVar72,auVar76);
                  auVar109 = vfmadd213ps_fma(auVar121,auVar72,auVar145);
                  auVar121 = vroundps_avx(ZEXT1632(auVar109),1);
                  auVar76 = vcmpps_avx(ZEXT1632(auVar109),auVar121,1);
                  auVar76 = vandps_avx(auVar76,auVar59);
                  auVar76 = vsubps_avx(auVar121,auVar76);
                  auVar61._8_4_ = 0x3f318000;
                  auVar61._0_8_ = 0x3f3180003f318000;
                  auVar61._12_4_ = 0x3f318000;
                  auVar61._16_4_ = 0x3f318000;
                  auVar61._20_4_ = 0x3f318000;
                  auVar61._24_4_ = 0x3f318000;
                  auVar61._28_4_ = 0x3f318000;
                  auVar109 = vfmsub231ps_fma(auVar72,auVar76,auVar61);
                  auVar117._8_4_ = 0x395e8083;
                  auVar117._0_8_ = 0x395e8083395e8083;
                  auVar117._12_4_ = 0x395e8083;
                  auVar117._16_4_ = 0x395e8083;
                  auVar117._20_4_ = 0x395e8083;
                  auVar117._24_4_ = 0x395e8083;
                  auVar117._28_4_ = 0x395e8083;
                  auVar164 = vfmsub231ps_fma(ZEXT1632(auVar109),auVar76,auVar117);
                  auVar72 = ZEXT1632(auVar164);
                  auVar19._28_4_ = auVar121._28_4_;
                  auVar19._0_28_ =
                       ZEXT1628(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                          CONCAT48(auVar164._8_4_ * auVar164._8_4_,
                                                   CONCAT44(auVar164._4_4_ * auVar164._4_4_,
                                                            auVar164._0_4_ * auVar164._0_4_))));
                  auVar62._8_4_ = 0x3ab743ce;
                  auVar62._0_8_ = 0x3ab743ce3ab743ce;
                  auVar62._12_4_ = 0x3ab743ce;
                  auVar62._16_4_ = 0x3ab743ce;
                  auVar62._20_4_ = 0x3ab743ce;
                  auVar62._24_4_ = 0x3ab743ce;
                  auVar62._28_4_ = 0x3ab743ce;
                  auVar109 = vfmadd213ps_fma(auVar57,auVar72,auVar62);
                  auVar118._8_4_ = 0x3c088908;
                  auVar118._0_8_ = 0x3c0889083c088908;
                  auVar118._12_4_ = 0x3c088908;
                  auVar118._16_4_ = 0x3c088908;
                  auVar118._20_4_ = 0x3c088908;
                  auVar118._24_4_ = 0x3c088908;
                  auVar118._28_4_ = 0x3c088908;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar72,auVar118);
                  auVar119._8_4_ = 0x3d2aa9c1;
                  auVar119._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar119._12_4_ = 0x3d2aa9c1;
                  auVar119._16_4_ = 0x3d2aa9c1;
                  auVar119._20_4_ = 0x3d2aa9c1;
                  auVar119._24_4_ = 0x3d2aa9c1;
                  auVar119._28_4_ = 0x3d2aa9c1;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar72,auVar119);
                  auVar120._8_4_ = 0x3e2aaaaa;
                  auVar120._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar120._12_4_ = 0x3e2aaaaa;
                  auVar120._16_4_ = 0x3e2aaaaa;
                  auVar120._20_4_ = 0x3e2aaaaa;
                  auVar120._24_4_ = 0x3e2aaaaa;
                  auVar120._28_4_ = 0x3e2aaaaa;
                  auVar72 = ZEXT1632(auVar164);
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar72,auVar120);
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar72,auVar145);
                  auVar65 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar19,auVar72);
                  auVar63._0_4_ = (int)auVar76._0_4_;
                  auVar63._4_4_ = (int)auVar76._4_4_;
                  auVar63._8_4_ = (int)auVar76._8_4_;
                  auVar63._12_4_ = (int)auVar76._12_4_;
                  auVar73._16_4_ = (int)auVar76._16_4_;
                  auVar73._0_16_ = auVar63;
                  auVar73._20_4_ = (int)auVar76._20_4_;
                  auVar73._24_4_ = (int)auVar76._24_4_;
                  auVar73._28_4_ = (int)auVar76._28_4_;
                  auVar164 = vpslld_avx(auVar63,0x17);
                  auVar109 = vpslld_avx(auVar73._16_16_,0x17);
                  auVar110._8_4_ = 0x3f800000;
                  auVar110._0_8_ = 0x3f8000003f800000;
                  auVar110._12_4_ = 0x3f800000;
                  auVar109 = vpaddd_avx(auVar109,auVar110);
                  auVar164 = vpaddd_avx(auVar164,auVar110);
                  auVar74._16_16_ = auVar109;
                  auVar74._0_16_ = auVar164;
                  auVar105._0_4_ = auVar65._0_4_ + fVar48;
                  auVar105._4_4_ = auVar65._4_4_ + fVar192;
                  auVar105._8_4_ = auVar65._8_4_ + fVar193;
                  auVar105._12_4_ = auVar65._12_4_ + fVar2;
                  auVar105._16_4_ = fVar106 + 0.0;
                  auVar105._20_4_ = fVar15 + 0.0;
                  auVar105._24_4_ = fVar16 + 0.0;
                  auVar105._28_4_ = fVar17 + 0.0;
                  auVar109 = vfmadd213ps_fma(auVar74,auVar105,auVar59);
                  auVar76 = vrcpps_avx(ZEXT1632(auVar109));
                  auVar109 = vfmsub213ps_fma(ZEXT1632(auVar109),auVar76,auVar59);
                  auVar109 = vfnmadd132ps_fma(ZEXT1632(auVar109),auVar76,auVar76);
                  auVar76 = ZEXT1632(auVar109);
                  break;
                case 5:
                  auVar176._8_4_ = 0x42b0c0a5;
                  auVar176._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar176._12_4_ = 0x42b0c0a5;
                  auVar176._16_4_ = 0x42b0c0a5;
                  auVar176._20_4_ = 0x42b0c0a5;
                  auVar176._24_4_ = 0x42b0c0a5;
                  auVar176._28_4_ = 0x42b0c0a5;
                  auVar76 = vminps_avx(auVar176,auVar76);
                  auVar18 = vmaxps_avx(auVar72,auVar76);
                  auVar109 = vfmadd213ps_fma(auVar121,auVar18,auVar145);
                  auVar98 = vroundps_avx(ZEXT1632(auVar109),1);
                  auVar76 = vcmpps_avx(ZEXT1632(auVar109),auVar98,1);
                  auVar76 = vandps_avx(auVar76,auVar59);
                  auVar76 = vsubps_avx(auVar98,auVar76);
                  auVar146._8_4_ = 0x3f318000;
                  auVar146._0_8_ = 0x3f3180003f318000;
                  auVar146._12_4_ = 0x3f318000;
                  auVar146._16_4_ = 0x3f318000;
                  auVar146._20_4_ = 0x3f318000;
                  auVar146._24_4_ = 0x3f318000;
                  auVar146._28_4_ = 0x3f318000;
                  auVar109 = vfmsub231ps_fma(auVar18,auVar76,auVar146);
                  auVar52._8_4_ = 0xb95e8083;
                  auVar52._0_8_ = 0xb95e8083b95e8083;
                  auVar52._12_4_ = 0xb95e8083;
                  auVar52._16_4_ = 0xb95e8083;
                  auVar52._20_4_ = 0xb95e8083;
                  auVar52._24_4_ = 0xb95e8083;
                  auVar52._28_4_ = 0xb95e8083;
                  auVar164 = vfnmsub231ps_fma(ZEXT1632(auVar109),auVar76,auVar52);
                  auVar52 = ZEXT1632(auVar164);
                  auVar18._28_4_ = auVar98._28_4_;
                  auVar18._0_28_ =
                       ZEXT1628(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                          CONCAT48(auVar164._8_4_ * auVar164._8_4_,
                                                   CONCAT44(auVar164._4_4_ * auVar164._4_4_,
                                                            auVar164._0_4_ * auVar164._0_4_))));
                  auVar183._8_4_ = 0x3ab743ce;
                  auVar183._0_8_ = 0x3ab743ce3ab743ce;
                  auVar183._12_4_ = 0x3ab743ce;
                  auVar183._16_4_ = 0x3ab743ce;
                  auVar183._20_4_ = 0x3ab743ce;
                  auVar183._24_4_ = 0x3ab743ce;
                  auVar183._28_4_ = 0x3ab743ce;
                  auVar109 = vfmadd213ps_fma(auVar57,auVar52,auVar183);
                  auVar153._8_4_ = 0x3c088908;
                  auVar153._0_8_ = 0x3c0889083c088908;
                  auVar153._12_4_ = 0x3c088908;
                  auVar153._16_4_ = 0x3c088908;
                  auVar153._20_4_ = 0x3c088908;
                  auVar153._24_4_ = 0x3c088908;
                  auVar153._28_4_ = 0x3c088908;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar52,auVar153);
                  auVar132._8_4_ = 0x3d2aa9c1;
                  auVar132._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar132._12_4_ = 0x3d2aa9c1;
                  auVar132._16_4_ = 0x3d2aa9c1;
                  auVar132._20_4_ = 0x3d2aa9c1;
                  auVar132._24_4_ = 0x3d2aa9c1;
                  auVar132._28_4_ = 0x3d2aa9c1;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar52,auVar132);
                  auVar53._8_4_ = 0x3e2aaaaa;
                  auVar53._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar53._12_4_ = 0x3e2aaaaa;
                  auVar53._16_4_ = 0x3e2aaaaa;
                  auVar53._20_4_ = 0x3e2aaaaa;
                  auVar53._24_4_ = 0x3e2aaaaa;
                  auVar53._28_4_ = 0x3e2aaaaa;
                  auVar98 = ZEXT1632(auVar164);
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar98,auVar53);
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar98,auVar145);
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar18,auVar98);
                  auVar99._0_4_ = auVar109._0_4_ + fVar48;
                  auVar99._4_4_ = auVar109._4_4_ + fVar192;
                  auVar99._8_4_ = auVar109._8_4_ + fVar193;
                  auVar99._12_4_ = auVar109._12_4_ + fVar2;
                  auVar99._16_4_ = fVar106 + 0.0;
                  auVar99._20_4_ = fVar15 + 0.0;
                  auVar99._24_4_ = fVar16 + 0.0;
                  auVar99._28_4_ = fVar17 + 0.0;
                  auVar108._0_4_ = (int)auVar76._0_4_;
                  auVar108._4_4_ = (int)auVar76._4_4_;
                  auVar108._8_4_ = (int)auVar76._8_4_;
                  auVar108._12_4_ = (int)auVar76._12_4_;
                  auVar113._16_4_ = (int)auVar76._16_4_;
                  auVar113._0_16_ = auVar108;
                  auVar113._20_4_ = (int)auVar76._20_4_;
                  auVar113._24_4_ = (int)auVar76._24_4_;
                  auVar113._28_4_ = (int)auVar76._28_4_;
                  auVar164 = vpslld_avx(auVar108,0x17);
                  auVar109 = vpslld_avx(auVar113._16_16_,0x17);
                  auVar147._8_4_ = 0x3f800000;
                  auVar147._0_8_ = 0x3f8000003f800000;
                  auVar147._12_4_ = 0x3f800000;
                  auVar109 = vpaddd_avx(auVar147,auVar109);
                  auVar164 = vpaddd_avx(auVar164,auVar147);
                  auVar189._16_16_ = auVar109;
                  auVar189._0_16_ = auVar164;
                  auVar65 = vfmadd213ps_fma(auVar189,auVar99,auVar59);
                  auVar54._8_4_ = 0x800000;
                  auVar54._0_8_ = 0x80000000800000;
                  auVar54._12_4_ = 0x800000;
                  auVar54._16_4_ = 0x800000;
                  auVar54._20_4_ = 0x800000;
                  auVar54._24_4_ = 0x800000;
                  auVar54._28_4_ = 0x800000;
                  auVar76 = vmaxps_avx(ZEXT1632(auVar65),auVar54);
                  auVar164 = vpsrld_avx(auVar76._0_16_,0x17);
                  auVar109 = vpsrld_avx(auVar76._16_16_,0x17);
                  auVar55._8_4_ = 0x807fffff;
                  auVar55._0_8_ = 0x807fffff807fffff;
                  auVar55._12_4_ = 0x807fffff;
                  auVar55._16_4_ = 0x807fffff;
                  auVar55._20_4_ = 0x807fffff;
                  auVar55._24_4_ = 0x807fffff;
                  auVar55._28_4_ = 0x807fffff;
                  auVar76 = vandps_avx(auVar76,auVar55);
                  auVar98 = vorps_avx(auVar76,auVar145);
                  auVar56._8_4_ = 0x3f3504f3;
                  auVar56._0_8_ = 0x3f3504f33f3504f3;
                  auVar56._12_4_ = 0x3f3504f3;
                  auVar56._16_4_ = 0x3f3504f3;
                  auVar56._20_4_ = 0x3f3504f3;
                  auVar56._24_4_ = 0x3f3504f3;
                  auVar56._28_4_ = 0x3f3504f3;
                  auVar18 = vcmpps_avx(auVar56,auVar98,2);
                  auVar76 = vandnps_avx(auVar18,auVar98);
                  auVar100._0_4_ = auVar76._0_4_ + auVar98._0_4_ + -1.0;
                  auVar100._4_4_ = auVar76._4_4_ + auVar98._4_4_ + -1.0;
                  auVar100._8_4_ = auVar76._8_4_ + auVar98._8_4_ + -1.0;
                  auVar100._12_4_ = auVar76._12_4_ + auVar98._12_4_ + -1.0;
                  auVar100._16_4_ = auVar76._16_4_ + auVar98._16_4_ + -1.0;
                  auVar100._20_4_ = auVar76._20_4_ + auVar98._20_4_ + -1.0;
                  auVar100._24_4_ = auVar76._24_4_ + auVar98._24_4_ + -1.0;
                  auVar100._28_4_ = auVar76._28_4_ + auVar98._28_4_ + -1.0;
                  auVar109 = vpsubd_avx(auVar109,auVar18._16_16_);
                  auVar172._8_4_ = 0xffffff81;
                  auVar172._0_8_ = 0xffffff81ffffff81;
                  auVar172._12_4_ = 0xffffff81;
                  auVar109 = vpaddd_avx(auVar109,auVar172);
                  auVar164 = vpsubd_avx(auVar164,auVar18._0_16_);
                  auVar164 = vpaddd_avx(auVar172,auVar164);
                  auVar114._16_16_ = auVar109;
                  auVar114._0_16_ = auVar164;
                  auVar76._4_4_ = auVar100._4_4_ * auVar100._4_4_;
                  auVar76._0_4_ = auVar100._0_4_ * auVar100._0_4_;
                  auVar76._8_4_ = auVar100._8_4_ * auVar100._8_4_;
                  auVar76._12_4_ = auVar100._12_4_ * auVar100._12_4_;
                  auVar76._16_4_ = auVar100._16_4_ * auVar100._16_4_;
                  auVar76._20_4_ = auVar100._20_4_ * auVar100._20_4_;
                  auVar76._24_4_ = auVar100._24_4_ * auVar100._24_4_;
                  auVar76._28_4_ = auVar18._28_4_;
                  auVar170._8_4_ = 0x3d9021bb;
                  auVar170._0_8_ = 0x3d9021bb3d9021bb;
                  auVar170._12_4_ = 0x3d9021bb;
                  auVar170._16_4_ = 0x3d9021bb;
                  auVar170._20_4_ = 0x3d9021bb;
                  auVar170._24_4_ = 0x3d9021bb;
                  auVar170._28_4_ = 0x3d9021bb;
                  auVar154._8_4_ = 0xbdebd1b8;
                  auVar154._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar154._12_4_ = 0xbdebd1b8;
                  auVar154._16_4_ = 0xbdebd1b8;
                  auVar154._20_4_ = 0xbdebd1b8;
                  auVar154._24_4_ = 0xbdebd1b8;
                  auVar154._28_4_ = 0xbdebd1b8;
                  auVar109 = vfmadd213ps_fma(auVar170,auVar100,auVar154);
                  auVar155._8_4_ = 0x3def251a;
                  auVar155._0_8_ = 0x3def251a3def251a;
                  auVar155._12_4_ = 0x3def251a;
                  auVar155._16_4_ = 0x3def251a;
                  auVar155._20_4_ = 0x3def251a;
                  auVar155._24_4_ = 0x3def251a;
                  auVar155._28_4_ = 0x3def251a;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar100,auVar155);
                  auVar156._8_4_ = 0xbdfe5d4f;
                  auVar156._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar156._12_4_ = 0xbdfe5d4f;
                  auVar156._16_4_ = 0xbdfe5d4f;
                  auVar156._20_4_ = 0xbdfe5d4f;
                  auVar156._24_4_ = 0xbdfe5d4f;
                  auVar156._28_4_ = 0xbdfe5d4f;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar100,auVar156);
                  auVar157._8_4_ = 0x3e11e9bf;
                  auVar157._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar157._12_4_ = 0x3e11e9bf;
                  auVar157._16_4_ = 0x3e11e9bf;
                  auVar157._20_4_ = 0x3e11e9bf;
                  auVar157._24_4_ = 0x3e11e9bf;
                  auVar157._28_4_ = 0x3e11e9bf;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar100,auVar157);
                  auVar158._8_4_ = 0xbe2aae50;
                  auVar158._0_8_ = 0xbe2aae50be2aae50;
                  auVar158._12_4_ = 0xbe2aae50;
                  auVar158._16_4_ = 0xbe2aae50;
                  auVar158._20_4_ = 0xbe2aae50;
                  auVar158._24_4_ = 0xbe2aae50;
                  auVar158._28_4_ = 0xbe2aae50;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar100,auVar158);
                  auVar159._8_4_ = 0x3e4cceac;
                  auVar159._0_8_ = 0x3e4cceac3e4cceac;
                  auVar159._12_4_ = 0x3e4cceac;
                  auVar159._16_4_ = 0x3e4cceac;
                  auVar159._20_4_ = 0x3e4cceac;
                  auVar159._24_4_ = 0x3e4cceac;
                  auVar159._28_4_ = 0x3e4cceac;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar100,auVar159);
                  auVar160._8_4_ = 0xbe7ffffc;
                  auVar160._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar160._12_4_ = 0xbe7ffffc;
                  auVar160._16_4_ = 0xbe7ffffc;
                  auVar160._20_4_ = 0xbe7ffffc;
                  auVar160._24_4_ = 0xbe7ffffc;
                  auVar160._28_4_ = 0xbe7ffffc;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar100,auVar160);
                  auVar161._8_4_ = 0x3eaaaaaa;
                  auVar161._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar161._12_4_ = 0x3eaaaaaa;
                  auVar161._16_4_ = 0x3eaaaaaa;
                  auVar161._20_4_ = 0x3eaaaaaa;
                  auVar161._24_4_ = 0x3eaaaaaa;
                  auVar161._28_4_ = 0x3eaaaaaa;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar100,auVar161);
                  auVar171._0_4_ = auVar100._0_4_ * auVar100._0_4_ * auVar100._0_4_ * auVar109._0_4_
                  ;
                  auVar171._4_4_ = auVar100._4_4_ * auVar100._4_4_ * auVar100._4_4_ * auVar109._4_4_
                  ;
                  auVar171._8_4_ = auVar100._8_4_ * auVar100._8_4_ * auVar100._8_4_ * auVar109._8_4_
                  ;
                  auVar171._12_4_ =
                       auVar100._12_4_ * auVar100._12_4_ * auVar100._12_4_ * auVar109._12_4_;
                  auVar171._16_4_ = auVar100._16_4_ * auVar100._16_4_ * auVar100._16_4_ * 0.0;
                  auVar171._20_4_ = auVar100._20_4_ * auVar100._20_4_ * auVar100._20_4_ * 0.0;
                  auVar171._24_4_ = auVar100._24_4_ * auVar100._24_4_ * auVar100._24_4_ * 0.0;
                  auVar171._28_4_ = 0;
                  auVar18 = vcvtdq2ps_avx(auVar114);
                  auVar177._8_4_ = 0xb95e8083;
                  auVar177._0_8_ = 0xb95e8083b95e8083;
                  auVar177._12_4_ = 0xb95e8083;
                  auVar177._16_4_ = 0xb95e8083;
                  auVar177._20_4_ = 0xb95e8083;
                  auVar177._24_4_ = 0xb95e8083;
                  auVar177._28_4_ = 0xb95e8083;
                  auVar109 = vfmadd231ps_fma(auVar171,auVar18,auVar177);
                  auVar109 = vfmsub231ps_fma(ZEXT1632(auVar109),auVar145,auVar76);
                  auVar76 = vcmpps_avx(ZEXT1632(auVar65),ZEXT832(0) << 0x20,2);
                  auVar98 = vsubps_avx(ZEXT1632(auVar109),auVar100);
                  auVar109 = vfmsub231ps_fma(auVar98,auVar146,auVar18);
                  auVar162._8_4_ = 0xc0000000;
                  auVar162._0_8_ = 0xc0000000c0000000;
                  auVar162._12_4_ = 0xc0000000;
                  auVar162._16_4_ = 0xc0000000;
                  auVar162._20_4_ = 0xc0000000;
                  auVar162._24_4_ = 0xc0000000;
                  auVar162._28_4_ = 0xc0000000;
                  auVar101._0_4_ = auVar109._0_4_ * -2.0;
                  auVar101._4_4_ = auVar109._4_4_ * -2.0;
                  auVar101._8_4_ = auVar109._8_4_ * -2.0;
                  auVar101._12_4_ = auVar109._12_4_ * -2.0;
                  auVar101._16_4_ = 0x80000000;
                  auVar101._20_4_ = 0x80000000;
                  auVar101._24_4_ = 0x80000000;
                  auVar101._28_4_ = 0;
                  auVar115._8_4_ = 0x7fffffff;
                  auVar115._0_8_ = 0x7fffffff7fffffff;
                  auVar115._12_4_ = 0x7fffffff;
                  auVar115._16_4_ = 0x7fffffff;
                  auVar115._20_4_ = 0x7fffffff;
                  auVar115._24_4_ = 0x7fffffff;
                  auVar115._28_4_ = 0x7fffffff;
                  auVar76 = vblendvps_avx(auVar101,auVar115,auVar76);
                  auVar76 = vminps_avx(auVar176,auVar76);
                  auVar179 = ZEXT3264(auVar72);
                  auVar72 = vmaxps_avx(auVar72,auVar76);
                  auVar181 = ZEXT3264(auVar121);
                  auVar109 = vfmadd213ps_fma(auVar121,auVar72,auVar145);
                  auVar121 = vroundps_avx(ZEXT1632(auVar109),1);
                  auVar76 = vcmpps_avx(ZEXT1632(auVar109),auVar121,1);
                  auVar76 = vandps_avx(auVar76,auVar59);
                  auVar76 = vsubps_avx(auVar121,auVar76);
                  auVar109 = vfmsub231ps_fma(auVar72,auVar76,auVar146);
                  auVar164 = vfnmsub231ps_fma(ZEXT1632(auVar109),auVar76,auVar177);
                  auVar72 = ZEXT1632(auVar164);
                  auVar98._28_4_ = auVar121._28_4_;
                  auVar98._0_28_ =
                       ZEXT1628(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                          CONCAT48(auVar164._8_4_ * auVar164._8_4_,
                                                   CONCAT44(auVar164._4_4_ * auVar164._4_4_,
                                                            auVar164._0_4_ * auVar164._0_4_))));
                  auVar184 = ZEXT3264(auVar57);
                  auVar109 = vfmadd213ps_fma(auVar57,auVar72,auVar183);
                  auVar190._8_4_ = 0x3c088908;
                  auVar190._0_8_ = 0x3c0889083c088908;
                  auVar190._12_4_ = 0x3c088908;
                  auVar190._16_4_ = 0x3c088908;
                  auVar190._20_4_ = 0x3c088908;
                  auVar190._24_4_ = 0x3c088908;
                  auVar190._28_4_ = 0x3c088908;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar72,auVar190);
                  auVar57._8_4_ = 0x3d2aa9c1;
                  auVar57._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar57._12_4_ = 0x3d2aa9c1;
                  auVar57._16_4_ = 0x3d2aa9c1;
                  auVar57._20_4_ = 0x3d2aa9c1;
                  auVar57._24_4_ = 0x3d2aa9c1;
                  auVar57._28_4_ = 0x3d2aa9c1;
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar72,auVar57);
                  auVar58._8_4_ = 0x3e2aaaaa;
                  auVar58._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar58._12_4_ = 0x3e2aaaaa;
                  auVar58._16_4_ = 0x3e2aaaaa;
                  auVar58._20_4_ = 0x3e2aaaaa;
                  auVar58._24_4_ = 0x3e2aaaaa;
                  auVar58._28_4_ = 0x3e2aaaaa;
                  auVar72 = ZEXT1632(auVar164);
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar72,auVar58);
                  auVar109 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar72,auVar145);
                  auVar65 = vfmadd213ps_fma(ZEXT1632(auVar109),auVar98,auVar72);
                  auVar142 = ZEXT3264(auVar59);
                  auVar79._0_4_ = (int)auVar76._0_4_;
                  auVar79._4_4_ = (int)auVar76._4_4_;
                  auVar79._8_4_ = (int)auVar76._8_4_;
                  auVar79._12_4_ = (int)auVar76._12_4_;
                  auVar102._16_4_ = (int)auVar76._16_4_;
                  auVar102._0_16_ = auVar79;
                  auVar102._20_4_ = (int)auVar76._20_4_;
                  auVar102._24_4_ = (int)auVar76._24_4_;
                  auVar102._28_4_ = (int)auVar76._28_4_;
                  auVar164 = vpslld_avx(auVar79,0x17);
                  auVar109 = vpslld_avx(auVar102._16_16_,0x17);
                  auVar123._8_4_ = 0x3f800000;
                  auVar123._0_8_ = 0x3f8000003f800000;
                  auVar123._12_4_ = 0x3f800000;
                  auVar109 = vpaddd_avx(auVar109,auVar123);
                  auVar164 = vpaddd_avx(auVar164,auVar123);
                  auVar103._16_16_ = auVar109;
                  auVar103._0_16_ = auVar164;
                  auVar116._0_4_ = auVar65._0_4_ + fVar48;
                  auVar116._4_4_ = auVar65._4_4_ + fVar192;
                  auVar116._8_4_ = auVar65._8_4_ + fVar193;
                  auVar116._12_4_ = auVar65._12_4_ + fVar2;
                  auVar116._16_4_ = fVar106 + 0.0;
                  auVar116._20_4_ = fVar15 + 0.0;
                  auVar116._24_4_ = fVar16 + 0.0;
                  auVar116._28_4_ = fVar17 + 0.0;
                  auVar109 = vfmadd213ps_fma(auVar103,auVar116,auVar59);
                  auVar76 = vrcpps_avx(ZEXT1632(auVar109));
                  auVar109 = vfmsub213ps_fma(ZEXT1632(auVar109),auVar76,auVar59);
                  auVar109 = vfnmadd132ps_fma(ZEXT1632(auVar109),auVar76,auVar76);
                  auVar59._8_4_ = 0xbf800000;
                  auVar59._0_8_ = 0xbf800000bf800000;
                  auVar59._12_4_ = 0xbf800000;
                  auVar59._16_4_ = 0xbf800000;
                  auVar59._20_4_ = 0xbf800000;
                  auVar59._24_4_ = 0xbf800000;
                  auVar59._28_4_ = 0xbf800000;
                  auVar109 = vfnmadd213ps_fma(ZEXT1632(auVar109),auVar162,auVar59);
                  auVar97 = ZEXT1628(auVar109);
                  goto LAB_0042e28f;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var30);
                  auVar72._4_4_ = uVar1;
                  auVar72._0_4_ = uVar1;
                  auVar72._8_4_ = uVar1;
                  auVar72._12_4_ = uVar1;
                  auVar72._16_4_ = uVar1;
                  auVar72._20_4_ = uVar1;
                  auVar72._24_4_ = uVar1;
                  auVar72._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var30))[1];
                  auVar121._4_4_ = uVar1;
                  auVar121._0_4_ = uVar1;
                  auVar121._8_4_ = uVar1;
                  auVar121._12_4_ = uVar1;
                  auVar121._16_4_ = uVar1;
                  auVar121._20_4_ = uVar1;
                  auVar121._24_4_ = uVar1;
                  auVar121._28_4_ = uVar1;
                  auVar109 = vfmadd231ps_fma(auVar121,auVar76,auVar72);
                  auVar76 = vmaxps_avx(ZEXT1632(auVar109),_DAT_00561140);
                  auVar76 = vminps_avx(auVar76,auVar59);
                  auVar97 = auVar76._0_28_;
LAB_0042e28f:
                  auVar78._0_4_ = auVar97._0_4_ * auVar77._0_4_;
                  auVar78._4_4_ = auVar97._4_4_ * auVar77._4_4_;
                  auVar78._8_4_ = auVar97._8_4_ * auVar77._8_4_;
                  auVar78._12_4_ = auVar97._12_4_ * auVar77._12_4_;
                  auVar78._16_4_ = auVar97._16_4_ * auVar77._16_4_;
                  auVar78._20_4_ = auVar97._20_4_ * auVar77._20_4_;
                  auVar78._24_4_ = auVar97._24_4_ * auVar77._24_4_;
                  auVar76 = auVar78._0_32_;
                }
                *pauVar41 = auVar76;
                pauVar41 = pauVar41 + 1;
                iVar32 = iVar32 + 1;
                local_278 = local_278 + 1;
              } while (iVar32 != _w);
            }
            iVar27 = iVar27 + 1;
          } while (iVar27 != _h);
        }
        local_2a8 = local_2a8 + 1;
      } while (local_2a8 != uVar34);
    }
LAB_0042f3ec:
    pMVar20 = local_170;
    local_1e8 = pvVar40;
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86_fma +
               (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]),&local_238,local_170,opt);
    if ((pMVar20->data != (void *)0x0) && (iVar39 = 0, (long)pMVar20->c * pMVar20->cstep != 0))
    goto LAB_0042f47f;
  }
  else {
    uVar45 = iVar22 / iVar39;
    uVar28 = *(int *)(&this->field_0xd0 + (long)p_Var30) / iVar39;
    local_2b8 = 1;
    _elempack = 1;
    if (opt->use_packing_layout == true) {
      local_2b8 = (uint)((uVar45 & 3) == 0) * 3 + 1;
      if ((uVar45 & 7) == 0) {
        local_2b8 = 8;
      }
      _elempack = (uint)((uVar28 & 3) == 0) * 3 + 1;
      if ((uVar28 & 7) == 0) {
        _elempack = 8;
      }
    }
    piVar12 = bottom_blob->refcount;
    local_168.data = bottom_blob->data;
    local_168.refcount = bottom_blob->refcount;
    local_168.elemsize = bottom_blob->elemsize;
    local_168.elempack = bottom_blob->elempack;
    local_168.allocator = bottom_blob->allocator;
    local_168.dims = bottom_blob->dims;
    local_168.w = bottom_blob->w;
    local_168.h = bottom_blob->h;
    local_168.d = bottom_blob->d;
    local_168.c = bottom_blob->c;
    local_168.cstep = bottom_blob->cstep;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    if (local_2b8 < iVar38) {
      local_1b8.data = *(void **)opt;
      local_1b8.elemsize = (size_t)opt->workspace_allocator;
      local_1b8.elempack = opt->openmp_blocktime;
      local_1b8._28_1_ = opt->use_winograd_convolution;
      local_1b8._29_1_ = opt->use_sgemm_convolution;
      local_1b8._30_1_ = opt->use_int8_inference;
      local_1b8._31_1_ = opt->use_vulkan_compute;
      local_1b8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1b8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      local_1b8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1b8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_1b8.refcount = (int *)opt->workspace_allocator;
      convert_packing(bottom_blob,&local_168,local_2b8,(Option *)&local_1b8);
    }
    piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    local_1b8.refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    local_1b8.data = local_238.data;
    local_1b8.elemsize = local_238.elemsize;
    local_1b8.elempack = local_238.elempack;
    local_1b8.allocator = local_238.allocator;
    local_1b8.w = local_238.w;
    local_1b8.dims = local_238.dims;
    local_1b8.h = local_238.h;
    local_1b8.d = local_238.d;
    local_1b8.c = local_238.c;
    local_1b8.cstep = local_238.cstep;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    pp_Var31 = this->_vptr_DeconvolutionDepthWise_x86_fma;
    if (uVar23 <= _elempack) {
LAB_0042e508:
      if (0 < *(int *)(&this->field_0x114 + (long)pp_Var31[-3])) {
        local_1e8._0_4_ = (int)uVar45 / local_2b8;
        iVar27 = 0;
        iVar38 = 0;
        lVar35 = 0;
        do {
          local_c0 = (void *)((long)(iVar27 / local_2b8) * local_168.cstep * local_168.elemsize +
                             (long)local_168.data);
          local_b8 = (int *)0x0;
          local_b0 = local_168.elemsize;
          local_a8 = local_168.elempack;
          local_a0 = local_168.allocator;
          local_88 = (int)local_1e8;
          local_80 = ((long)local_168.d * local_168.elemsize * (long)local_168.h * (long)local_168.w
                      + 0xf & 0xfffffffffffffff0) / local_168.elemsize;
          local_98 = local_168.dims;
          iStack_94 = local_168.w;
          iStack_90 = local_168.h;
          iStack_8c = local_168.d;
          local_108 = (void *)((long)(iVar38 / (int)_elempack) * local_1b8.cstep *
                               local_1b8.elemsize + (long)local_1b8.data);
          local_100 = (int *)0x0;
          local_f8 = local_1b8.elemsize;
          local_f0 = local_1b8.elempack;
          local_e8 = local_1b8.allocator;
          local_c8 = ((long)local_1b8.d * local_1b8.elemsize * (long)local_1b8.h * (long)local_1b8.w
                      + 0xf & 0xfffffffffffffff0) / local_1b8.elemsize;
          local_e0 = local_1b8.dims;
          iStack_dc = local_1b8.w;
          iStack_d8 = local_1b8.h;
          iStack_d4 = local_1b8.d;
          pLVar14 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar35];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          pAStack_68 = opt->workspace_allocator;
          uStack_60._0_4_ = opt->openmp_blocktime;
          uStack_60._4_1_ = opt->use_winograd_convolution;
          uStack_60._5_1_ = opt->use_sgemm_convolution;
          uStack_60._6_1_ = opt->use_int8_inference;
          uStack_60._7_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          pAStack_70 = local_1b8.allocator;
          local_d0 = (int)uVar28 / (int)_elempack;
          (*pLVar14->_vptr_Layer[7])(pLVar14,&local_c0,&local_108,&local_78);
          if (local_100 != (int *)0x0) {
            LOCK();
            *local_100 = *local_100 + -1;
            UNLOCK();
            if (*local_100 == 0) {
              if (local_e8 == (Allocator *)0x0) {
                if (local_108 != (void *)0x0) {
                  free(local_108);
                }
              }
              else {
                (*local_e8->_vptr_Allocator[3])();
              }
            }
          }
          if (local_b8 != (int *)0x0) {
            LOCK();
            *local_b8 = *local_b8 + -1;
            UNLOCK();
            if (*local_b8 == 0) {
              if (local_a0 == (Allocator *)0x0) {
                if (local_c0 != (void *)0x0) {
                  free(local_c0);
                }
              }
              else {
                (*local_a0->_vptr_Allocator[3])();
              }
            }
          }
          lVar35 = lVar35 + 1;
          iVar38 = iVar38 + uVar28;
          iVar27 = iVar27 + uVar45;
        } while (lVar35 < *(int *)(&this->field_0x114 +
                                  (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]));
      }
      if (_elempack < uVar23) {
        convert_packing(&local_1b8,&local_238,uVar23,opt);
      }
      else {
        if (local_1b8.refcount != (int *)0x0) {
          LOCK();
          *local_1b8.refcount = *local_1b8.refcount + 1;
          UNLOCK();
        }
        piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_238.allocator == (Allocator *)0x0) {
              if (local_238.data != (void *)0x0) {
                free(local_238.data);
              }
            }
            else {
              (*(local_238.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_238.data = local_1b8.data;
        local_238.refcount._0_4_ = SUB84(local_1b8.refcount,0);
        local_238.refcount._4_4_ = (undefined4)((ulong)local_1b8.refcount >> 0x20);
        local_238.elemsize = local_1b8.elemsize;
        local_238.elempack = local_1b8.elempack;
        local_238.allocator = local_1b8.allocator;
        local_238.dims = local_1b8.dims;
        local_238.w = local_1b8.w;
        local_238.h = local_1b8.h;
        local_238.d = local_1b8.d;
        local_238.c = local_1b8.c;
        local_238.cstep = local_1b8.cstep;
      }
      if (local_1b8.refcount != (int *)0x0) {
        LOCK();
        *local_1b8.refcount = *local_1b8.refcount + -1;
        UNLOCK();
        if (*local_1b8.refcount == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pvVar40 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
      if (local_168.refcount != (int *)0x0) {
        LOCK();
        *local_168.refcount = *local_168.refcount + -1;
        UNLOCK();
        pvVar40 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
        if (*local_168.refcount == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            pvVar40 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
              pvVar40 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
            pvVar40 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
          }
        }
      }
      goto LAB_0042f3ec;
    }
    Mat::create(&local_1b8,_w,_h,*(int *)(&this->field_0xd0 + (long)pp_Var31[-3]) / (int)_elempack,
                (ulong)_elempack * (sVar46 / uVar23),_elempack,opt->workspace_allocator);
    if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
      pp_Var31 = this->_vptr_DeconvolutionDepthWise_x86_fma;
      goto LAB_0042e508;
    }
    if (local_1b8.refcount != (int *)0x0) {
      LOCK();
      *local_1b8.refcount = *local_1b8.refcount + -1;
      UNLOCK();
      if (*local_1b8.refcount == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1e8 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
    if (local_168.refcount != (int *)0x0) {
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      local_1e8 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
      if (*local_168.refcount == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
        }
      }
    }
  }
  iVar39 = -100;
LAB_0042f47f:
  piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}